

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void groupConcatValue(sqlite3_context *context)

{
  sqlite3_str *p;
  char *z;
  char *zText;
  sqlite3_str *pAccum;
  sqlite3_context *context_local;
  
  p = (sqlite3_str *)sqlite3_aggregate_context(context,0);
  if (p != (sqlite3_str *)0x0) {
    if (p->accError == '\x12') {
      sqlite3_result_error_toobig(context);
    }
    else if (p->accError == '\a') {
      sqlite3_result_error_nomem(context);
    }
    else {
      z = sqlite3_str_value(p);
      sqlite3_result_text(context,z,-1,(_func_void_void_ptr *)0xffffffffffffffff);
    }
  }
  return;
}

Assistant:

static void groupConcatValue(sqlite3_context *context){
  sqlite3_str *pAccum;
  pAccum = (sqlite3_str*)sqlite3_aggregate_context(context, 0);
  if( pAccum ){
    if( pAccum->accError==SQLITE_TOOBIG ){
      sqlite3_result_error_toobig(context);
    }else if( pAccum->accError==SQLITE_NOMEM ){
      sqlite3_result_error_nomem(context);
    }else{    
      const char *zText = sqlite3_str_value(pAccum);
      sqlite3_result_text(context, zText, -1, SQLITE_TRANSIENT);
    }
  }
}